

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O1

void __thiscall QProgressDialogPrivate::_q_disconnectOnClose(QProgressDialogPrivate *this)

{
  Data *pDVar1;
  char *pcVar2;
  QObject *pQVar3;
  
  pDVar1 = (this->receiverToDisconnectOnClose).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->receiverToDisconnectOnClose).wp.value != (QObject *)0x0)) {
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = (this->receiverToDisconnectOnClose).wp.value;
    }
    pcVar2 = (this->memberToDisconnectOnClose).d.ptr;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect(*(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8,
                        "2canceled()",pQVar3,pcVar2);
    pDVar1 = (this->receiverToDisconnectOnClose).wp.d;
    (this->receiverToDisconnectOnClose).wp.d = (Data *)0x0;
    (this->receiverToDisconnectOnClose).wp.value = (QObject *)0x0;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
  }
  QByteArray::clear();
  return;
}

Assistant:

void QProgressDialogPrivate::_q_disconnectOnClose()
{
    Q_Q(QProgressDialog);
    if (receiverToDisconnectOnClose) {
        QObject::disconnect(q, SIGNAL(canceled()), receiverToDisconnectOnClose,
                            memberToDisconnectOnClose);
        receiverToDisconnectOnClose = nullptr;
    }
    memberToDisconnectOnClose.clear();
}